

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BroadcastToStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttostatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  BroadcastToStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_broadcasttostatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_broadcasttostatic(this);
    this_00 = (BroadcastToStaticLayerParams *)operator_new(0x28);
    BroadcastToStaticLayerParams::BroadcastToStaticLayerParams(this_00);
    (this->layer_).broadcasttostatic_ = this_00;
  }
  return (BroadcastToStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToStaticLayerParams* NeuralNetworkLayer::mutable_broadcasttostatic() {
  if (!has_broadcasttostatic()) {
    clear_layer();
    set_has_broadcasttostatic();
    layer_.broadcasttostatic_ = new ::CoreML::Specification::BroadcastToStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToStatic)
  return layer_.broadcasttostatic_;
}